

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5AsciiCreate(void *pUnused,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  char *zArg_00;
  int iVar1;
  char *zArg;
  Fts5Tokenizer *pFStack_38;
  int i;
  AsciiTokenizer *p;
  int rc;
  Fts5Tokenizer **ppOut_local;
  int nArg_local;
  char **azArg_local;
  void *pUnused_local;
  
  p._4_4_ = 0;
  pFStack_38 = (Fts5Tokenizer *)0x0;
  if (nArg % 2 == 0) {
    pFStack_38 = (Fts5Tokenizer *)sqlite3_malloc(0x80);
    if (pFStack_38 == (Fts5Tokenizer *)0x0) {
      p._4_4_ = 7;
    }
    else {
      memset(pFStack_38,0,0x80);
      memcpy(pFStack_38,aAsciiTokenChar,0x80);
      for (zArg._4_4_ = 0; p._4_4_ == 0 && zArg._4_4_ < nArg; zArg._4_4_ = zArg._4_4_ + 2) {
        zArg_00 = azArg[zArg._4_4_ + 1];
        iVar1 = sqlite3_stricmp(azArg[zArg._4_4_],"tokenchars");
        if (iVar1 == 0) {
          fts5AsciiAddExceptions((AsciiTokenizer *)pFStack_38,zArg_00,1);
        }
        else {
          iVar1 = sqlite3_stricmp(azArg[zArg._4_4_],"separators");
          if (iVar1 == 0) {
            fts5AsciiAddExceptions((AsciiTokenizer *)pFStack_38,zArg_00,0);
          }
          else {
            p._4_4_ = 1;
          }
        }
      }
      if (p._4_4_ != 0) {
        fts5AsciiDelete(pFStack_38);
        pFStack_38 = (Fts5Tokenizer *)0x0;
      }
    }
  }
  else {
    p._4_4_ = 1;
  }
  *ppOut = pFStack_38;
  return p._4_4_;
}

Assistant:

static int fts5AsciiCreate(
  void *pUnused, 
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  int rc = SQLITE_OK;
  AsciiTokenizer *p = 0;
  UNUSED_PARAM(pUnused);
  if( nArg%2 ){
    rc = SQLITE_ERROR;
  }else{
    p = sqlite3_malloc(sizeof(AsciiTokenizer));
    if( p==0 ){
      rc = SQLITE_NOMEM;
    }else{
      int i;
      memset(p, 0, sizeof(AsciiTokenizer));
      memcpy(p->aTokenChar, aAsciiTokenChar, sizeof(aAsciiTokenChar));
      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        const char *zArg = azArg[i+1];
        if( 0==sqlite3_stricmp(azArg[i], "tokenchars") ){
          fts5AsciiAddExceptions(p, zArg, 1);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "separators") ){
          fts5AsciiAddExceptions(p, zArg, 0);
        }else{
          rc = SQLITE_ERROR;
        }
      }
      if( rc!=SQLITE_OK ){
        fts5AsciiDelete((Fts5Tokenizer*)p);
        p = 0;
      }
    }
  }

  *ppOut = (Fts5Tokenizer*)p;
  return rc;
}